

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O0

QDebug * __thiscall
QDebug::putTupleLikeImplImpl
          (QDebug *this,char *ns,char *what,size_t n,StreamTypeErased *ops,void **data)

{
  long lVar1;
  QDebugStateSaver *this_00;
  long in_RCX;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  char *in_RSI;
  QDebug *in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  char in_stack_ffffffffffffff8f;
  QDebug *in_stack_ffffffffffffff90;
  QDebugStateSaver *in_stack_ffffffffffffffb0;
  QDebug *in_stack_ffffffffffffffb8;
  undefined8 *local_40;
  undefined8 *local_38;
  long local_30;
  QDebug *t;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  t = in_RDI;
  QDebugStateSaver::QDebugStateSaver(in_stack_ffffffffffffffb0,in_RDI);
  nospace(in_RDI);
  if ((in_RSI != (char *)0x0) && (*in_RSI != '\0')) {
    operator<<(in_stack_ffffffffffffffb8,(char *)t);
    operator<<(in_stack_ffffffffffffffb8,(char *)t);
  }
  operator<<(in_stack_ffffffffffffffb8,(char *)t);
  operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
  local_40 = in_R9;
  local_38 = in_R8;
  local_30 = in_RCX;
  while (lVar2 = local_30 + -1, local_30 != 0) {
    puVar3 = local_38 + 1;
    puVar4 = local_40 + 1;
    (*(code *)*local_38)(in_RDI,*local_40);
    local_40 = puVar4;
    local_38 = puVar3;
    local_30 = lVar2;
    if (lVar2 != 0) {
      operator<<(in_stack_ffffffffffffffb8,(char *)t);
    }
  }
  this_00 = (QDebugStateSaver *)operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
  QDebugStateSaver::~QDebugStateSaver(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QDebug *)this_00;
}

Assistant:

QDebug &QDebug::putTupleLikeImplImpl(const char *ns, const char *what,
                                     size_t n, StreamTypeErased *ops, const void **data)
{
    const QDebugStateSaver saver(*this);
    nospace();
    if (ns && *ns)
        *this << ns << "::";
    *this << what << '(';
    while (n--) {
        (*ops++)(*this, *data++);
        if (n)
            *this << ", ";
    }
    return *this << ')';
}